

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyReplacePreformattedSpaces(TidyDocImpl *doc,Node *node)

{
  Node **ppNVar1;
  Node *pNVar2;
  
  while (node != (Node *)0x0) {
    pNVar2 = node->next;
    if ((node->tag == (Dict *)0x0) || (node->tag->parser != prvTidyParsePre)) {
      ppNVar1 = &node->content;
      node = pNVar2;
      if (*ppNVar1 != (Node *)0x0) {
        prvTidyReplacePreformattedSpaces(doc,*ppNVar1);
      }
    }
    else {
      prvTidyNormalizeSpaces(doc->lexer,node->content);
      node = pNVar2;
    }
  }
  return;
}

Assistant:

void TY_(ReplacePreformattedSpaces)(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (node->tag && node->tag->parser == TY_(ParsePre))
        {
            TY_(NormalizeSpaces)(doc->lexer, node->content);
            node = next;
            continue;
        }

        if (node->content)
            TY_(ReplacePreformattedSpaces)(doc, node->content);

        node = next;
    }
}